

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O0

void __thiscall bandit::reporter::info::output_context_start_message(info *this)

{
  ostream *poVar1;
  reference pvVar2;
  string local_a0 [32];
  string local_80 [32];
  string local_60 [48];
  string local_30;
  info *local_10;
  info *this_local;
  
  poVar1 = (this->super_colored_base).stm_;
  local_10 = this;
  indent_abi_cxx11_(&local_30,this);
  poVar1 = std::operator<<(poVar1,(string *)&local_30);
  (*((this->super_colored_base).colorizer_)->_vptr_interface[4])(local_60);
  poVar1 = std::operator<<(poVar1,local_60);
  poVar1 = std::operator<<(poVar1,"begin ");
  (*((this->super_colored_base).colorizer_)->_vptr_interface[6])(local_80);
  poVar1 = std::operator<<(poVar1,local_80);
  pvVar2 = std::
           stack<bandit::reporter::info::context_info,_std::deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>_>
           ::top(&this->context_stack_);
  poVar1 = std::operator<<(poVar1,(string *)pvVar2);
  (*((this->super_colored_base).colorizer_)->_vptr_interface[7])(local_a0);
  poVar1 = std::operator<<(poVar1,local_a0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string((string *)&local_30);
  this->indentation_ = this->indentation_ + 1;
  std::ostream::flush();
  return;
}

Assistant:

void output_context_start_message() {
        stm_
            << indent()
            << colorizer_.info()
            << "begin "
            << colorizer_.emphasize()
            << context_stack_.top().desc
            << colorizer_.reset()
            << std::endl;
        ++indentation_;
        stm_.flush();
      }